

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object pybind11::detail::accessor_policies::list_item::get(handle obj,size_t index)

{
  PyObject **ppPVar1;
  undefined8 uVar2;
  undefined8 in_RDX;
  handle in_RDI;
  error_already_set *in_stack_00000010;
  PyObject *result;
  handle h;
  handle local_38 [3];
  PyObject *local_20;
  undefined8 local_18;
  handle local_10 [2];
  
  h.m_ptr = in_RDI.m_ptr;
  local_18 = in_RDX;
  ppPVar1 = pybind11::handle::ptr(local_10);
  local_20 = (PyObject *)PyList_GetItem(*ppPVar1,local_18);
  if (local_20 == (PyObject *)0x0) {
    uVar2 = __cxa_allocate_exception(0x28);
    error_already_set::error_already_set(in_stack_00000010);
    __cxa_throw(uVar2,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11::handle::handle(local_38,local_20);
  reinterpret_borrow<pybind11::object>(h);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

static object get(handle obj, size_t index) {
        PyObject *result = PyList_GetItem(obj.ptr(), static_cast<ssize_t>(index));
        if (!result) { throw error_already_set(); }
        return reinterpret_borrow<object>(result);
    }